

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O1

BTLeafNode * __thiscall
storage::BTLeafNode::insert_(BTLeafNode *this,int key,Record *record,bool *out)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  BTLeafNode *pBVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  
  *out = true;
  iVar2 = (this->super_BTNode).used_links_count_;
  uVar5 = iVar2 - 2;
  iVar8 = 0;
  uVar10 = uVar5;
  do {
    uVar12 = uVar10;
    iVar7 = iVar8;
    if ((int)uVar12 < iVar7) goto LAB_00104528;
    iVar9 = ((int)(uVar12 - iVar7) >> 1) + iVar7;
    iVar3 = (this->super_BTNode).keys_[iVar9];
    iVar8 = iVar7;
    uVar10 = uVar12;
    if (iVar3 != key) {
      if (key < iVar3) {
        uVar10 = iVar9 - 1;
      }
      else {
        iVar8 = iVar9 + 1;
      }
    }
  } while (iVar3 != key);
  if ((int)uVar12 < iVar7) {
LAB_00104528:
    if (0x32 < iVar2) {
      pBVar6 = split(this,key,record);
      return pBVar6;
    }
    if (1 < iVar2) {
      lVar11 = (ulong)(iVar2 - 1) + 0x1c;
      do {
        iVar2 = (this->super_BTNode).keys_[uVar5];
        if (iVar2 <= key) goto LAB_00104572;
        (this->super_BTNode).keys_[lVar11 + -0x1c] = iVar2;
        *(Record **)((this->super_BTNode).keys_ + lVar11 * 2 + -5) = this->record_links_[uVar5];
        lVar11 = lVar11 + -1;
        bVar4 = 0 < (int)uVar5;
        uVar5 = uVar5 - 1;
      } while (bVar4);
      uVar5 = 0xffffffff;
    }
LAB_00104572:
    (this->super_BTNode).keys_[(long)(int)uVar5 + 1] = key;
    this->record_links_[(long)(int)uVar5 + 1] = record;
    piVar1 = &(this->super_BTNode).used_links_count_;
    *piVar1 = *piVar1 + 1;
  }
  else {
    *out = false;
  }
  return (BTLeafNode *)0x0;
}

Assistant:

BTLeafNode *BTLeafNode::insert_(int key, Record *record, bool &out) {
        out = true;
        Record *a = nullptr;
        int index = -1;
        if (!search_record(key, a, index)) {
            if (!full()) {
                int i = 0;
                for (i = used_links_count_ - 2; i >= 0; --i) {
                    if (keys_[i] > key) {
                        keys_[i + 1] = keys_[i];
                        record_links_[i + 1] = record_links_[i];
                    } else {
                        break;
                    }
                }
                keys_[i + 1] = key;
                record_links_[i + 1] = record;
                used_links_count_++;
            } else {
                return split(key, record);
            }
        } else {
            out = false;
        }
        return nullptr;
    }